

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::Truncate
          (RepeatedField<google::protobuf::UnknownField> *this,int new_size)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (iVar2 < new_size) {
    Truncate();
  }
  if (new_size < iVar2) {
    if ((uVar1 & 4) != 0) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    if ((iVar2 != new_size) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,new_size);
    return;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Truncate(int new_size) {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_LE(new_size, old_size);
  if (new_size < old_size) {
    Element* elem = unsafe_elements(is_soo);
    Destroy(elem + new_size, elem + old_size);
    ExchangeCurrentSize(is_soo, new_size);
  }
}